

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

char * __thiscall
CVmImageFileExt::alloc_and_read
          (CVmImageFileExt *this,size_t len,uchar xor_mask,ulong remaining_in_page)

{
  char *buf;
  
  buf = alloc_mem(this,len,remaining_in_page);
  if (buf != (char *)0x0) {
    CVmFile::read_bytes(this->fp_,buf,len);
    CVmImagePool::apply_xor_mask(buf,len,xor_mask);
    return buf;
  }
  err_throw(0xca);
}

Assistant:

const char *CVmImageFileExt::alloc_and_read(size_t len, uchar xor_mask,
                                            ulong remaining_in_page)
{
    char *mem;
    
    /* allocate memory */
    mem = alloc_mem(len, remaining_in_page);
    if (mem == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* read the data */
    fp_->read_bytes(mem, len);

    /* if there's an XOR mask, apply it to each byte we read */
    CVmImagePool::apply_xor_mask(mem, len, xor_mask);

    /* return the memory block */
    return mem;
}